

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O3

void __thiscall BS::thread_pool::~thread_pool(thread_pool *this)

{
  thread *__ptr;
  
  wait_for_tasks(this);
  destroy_threads(this);
  __ptr = (this->threads)._M_t.
          super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (__ptr != (thread *)0x0) {
    std::default_delete<std::thread[]>::operator()
              ((default_delete<std::thread[]> *)&this->threads,__ptr);
  }
  (this->threads)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tasks).c);
  std::condition_variable::~condition_variable(&this->task_done_cv);
  std::condition_variable::~condition_variable(&this->task_available_cv);
  return;
}

Assistant:

~thread_pool()
    {
        wait_for_tasks();
        destroy_threads();
    }